

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkAllocationCallbackUtil.cpp
# Opt level: O2

AllocationCallbackRecord *
vk::AllocationCallbackRecord::reallocation
          (AllocationCallbackRecord *__return_storage_ptr__,void *original,size_t size,
          size_t alignment,VkSystemAllocationScope scope,void *returnedPtr)

{
  __return_storage_ptr__->type = TYPE_REALLOCATION;
  (__return_storage_ptr__->data).reallocation.original = original;
  (__return_storage_ptr__->data).allocation.alignment = size;
  (__return_storage_ptr__->data).reallocation.alignment = alignment;
  (__return_storage_ptr__->data).reallocation.scope = scope;
  (__return_storage_ptr__->data).reallocation.returnedPtr = returnedPtr;
  return __return_storage_ptr__;
}

Assistant:

AllocationCallbackRecord AllocationCallbackRecord::reallocation (void* original, size_t size, size_t alignment, VkSystemAllocationScope scope, void* returnedPtr)
{
	AllocationCallbackRecord record;

	record.type								= TYPE_REALLOCATION;
	record.data.reallocation.original		= original;
	record.data.reallocation.size			= size;
	record.data.reallocation.alignment		= alignment;
	record.data.reallocation.scope			= scope;
	record.data.reallocation.returnedPtr	= returnedPtr;

	return record;
}